

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O1

OpenGLExtensions __thiscall QOpenGLExtensions::openGLExtensions(QOpenGLExtensions *this)

{
  QOpenGLFunctionsPrivate *pQVar1;
  int iVar2;
  QFlagsStorage<QOpenGLExtensions::OpenGLExtension> QVar3;
  
  pQVar1 = (this->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr;
  if (pQVar1 == (QOpenGLFunctionsPrivate *)0x0) {
    QVar3.i = 0;
  }
  else {
    if (*(int *)((long)&pQVar1[2].field_0 + 0x260) == -1) {
      iVar2 = qt_gl_resolve_extensions();
      *(int *)((long)&pQVar1[2].field_0 + 0x260) = iVar2;
    }
    QVar3.i = *(Int *)((long)&pQVar1[2].field_0 + 0x260);
  }
  return (QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4>)
         (QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4>)QVar3.i;
}

Assistant:

QOpenGLExtensions::OpenGLExtensions QOpenGLExtensions::openGLExtensions()
{
    QOpenGLFunctionsPrivateEx *d = static_cast<QOpenGLFunctionsPrivateEx *>(d_ptr);
    if (!d)
        return { };
    if (d->m_extensions == -1)
        d->m_extensions = qt_gl_resolve_extensions();
    return QOpenGLExtensions::OpenGLExtensions(d->m_extensions);
}